

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O0

void clock_setunit(_clock *x,double timeunit,int sampflag)

{
  double dVar1;
  double local_40;
  double local_30;
  double timeleft;
  double dStack_18;
  int sampflag_local;
  double timeunit_local;
  _clock *x_local;
  
  dStack_18 = timeunit;
  if (timeunit <= 0.0) {
    dStack_18 = 1.0;
  }
  if ((((sampflag == 0) || (dStack_18 != (double)-x->c_unit)) ||
      (NAN(dStack_18) || NAN((double)-x->c_unit))) &&
     (((sampflag != 0 || (dVar1 = (double)x->c_unit * 14112.0, dStack_18 != dVar1)) ||
      (NAN(dStack_18) || NAN(dVar1))))) {
    if (0.0 < x->c_settime || x->c_settime == 0.0) {
      if (x->c_unit <= 0.0) {
        local_40 = (double)x->c_unit * (14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr);
      }
      else {
        local_40 = (double)x->c_unit;
      }
      local_30 = (x->c_settime - pd_maininstance.pd_systime) / local_40;
    }
    else {
      local_30 = -1.0;
    }
    if (sampflag == 0) {
      x->c_unit = (float)(dStack_18 * 14112.0);
    }
    else {
      x->c_unit = (float)-dStack_18;
    }
    if (0.0 <= local_30) {
      clock_delay(x,local_30);
    }
  }
  return;
}

Assistant:

void clock_setunit(t_clock *x, double timeunit, int sampflag)
{
    double timeleft;
    if (timeunit <= 0)
        timeunit = 1;
    /* if no change, return to avoid truncation errors recalculating delay */
    if ((sampflag && (timeunit == -x->c_unit)) ||
        (!sampflag && (timeunit == x->c_unit * TIMEUNITPERMSEC)))
            return;

        /* figure out time left in the units we were in */
    timeleft = (x->c_settime < 0 ? -1 :
        (x->c_settime - pd_this->pd_systime)/((x->c_unit > 0)? x->c_unit :
            (x->c_unit*(TIMEUNITPERSECOND/STUFF->st_dacsr))));
    if (sampflag)
        x->c_unit = -timeunit;  /* negate to flag sample-based */
    else x->c_unit = timeunit * TIMEUNITPERMSEC;
    if (timeleft >= 0)  /* reschedule if already set */
        clock_delay(x, timeleft);
}